

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update3sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double eps3,
          double *vec3,int *idx3,double *rhs3,int *ridx3,int *rn3,double *forest,int *forestNum,
          int *forestIdx)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *in_RCX;
  double *in_RDX;
  double *unaff_RBX;
  CLUFactor<double> *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  double *in_XMM0_Qa;
  CLUFactor<double> *unaff_retaddr;
  double *in_stack_00000008;
  double in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  double *in_stack_00000028;
  int *it;
  int *rperm;
  int *in_stack_00000040;
  int k;
  int j;
  int i;
  double x;
  double *eps_00;
  int *a;
  int *local_78;
  int local_60;
  int local_5c;
  undefined8 local_58;
  int *vidx;
  
  eps_00 = in_stack_00000028;
  a = in_stack_00000040;
  vidx = in_RDI;
  vSolveLright3((CLUFactor<double> *)it,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                in_stack_00000010,in_stack_00000008,(int *)unaff_retaddr,in_stack_00000040,
                (double)unaff_RBX,_j,(int *)x,(int *)eps3,(double)in_RDI);
  lVar1 = *(long *)(in_RDI + 0x10);
  if (eps3 == 0.0) {
    local_60 = 0;
    for (local_5c = 0; local_5c < *in_R9; local_5c = local_5c + 1) {
      iVar4 = in_R8[local_5c];
      local_58 = *(undefined8 *)(in_RCX + (long)iVar4 * 2);
      bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
      if (bVar2) {
        enQueueMax(in_R8,&local_60,*(int *)(lVar1 + (long)iVar4 * 4));
      }
      else {
        (in_RCX + (long)iVar4 * 2)[0] = 0;
        (in_RCX + (long)iVar4 * 2)[1] = 0;
      }
    }
    *in_R9 = local_60;
  }
  else {
    local_78 = rn;
    local_60 = 0;
    for (local_5c = 0; local_5c < *in_R9; local_5c = local_5c + 1) {
      iVar4 = in_R8[local_5c];
      local_58 = *(undefined8 *)(in_RCX + (long)iVar4 * 2);
      bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
      if (bVar2) {
        *local_78 = iVar4;
        enQueueMax(in_R8,&local_60,*(int *)(lVar1 + (long)iVar4 * 4));
        *(undefined8 *)((long)eps3 + (long)iVar4 * 8) = local_58;
        local_78 = local_78 + 1;
      }
      else {
        (in_RCX + (long)iVar4 * 2)[0] = 0;
        (in_RCX + (long)iVar4 * 2)[1] = 0;
      }
    }
    *in_R9 = local_60;
    *(int *)eps2 = local_60;
  }
  local_60 = 0;
  for (local_5c = 0; local_5c < *(int *)in_stack_00000028; local_5c = local_5c + 1) {
    iVar4 = in_stack_00000020[local_5c];
    local_58 = *(undefined8 *)(in_stack_00000018 + (long)iVar4 * 2);
    bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
    if (bVar2) {
      enQueueMax(in_stack_00000020,&local_60,*(int *)(lVar1 + (long)iVar4 * 4));
    }
    else {
      (in_stack_00000018 + (long)iVar4 * 2)[0] = 0;
      (in_stack_00000018 + (long)iVar4 * 2)[1] = 0;
    }
  }
  *(int *)in_stack_00000028 = local_60;
  local_60 = 0;
  for (local_5c = 0; iVar4 = (int)((ulong)in_R8 >> 0x20), local_5c < *(int *)x;
      local_5c = local_5c + 1) {
    iVar4 = *(int *)((long)_j + (long)local_5c * 4);
    local_58 = *(undefined8 *)(in_stack_00000040 + (long)iVar4 * 2);
    bVar2 = isNotZero<double,double>((double)a,(double)eps_00);
    if (bVar2) {
      enQueueMax((int *)_j,&local_60,*(int *)(lVar1 + (long)iVar4 * 4));
    }
    else {
      (in_stack_00000040 + (long)iVar4 * 2)[0] = 0;
      (in_stack_00000040 + (long)iVar4 * 2)[1] = 0;
    }
  }
  *(int *)x = local_60;
  iVar3 = vSolveUright(unaff_retaddr,unaff_RBX,vidx,in_XMM0_Qa,(int *)in_RSI,
                       (int)((ulong)in_RDX >> 0x20),(double)in_RCX);
  *in_R9 = iVar3;
  iVar3 = vSolveUright(unaff_retaddr,unaff_RBX,vidx,in_XMM0_Qa,(int *)in_RSI,
                       (int)((ulong)in_RDX >> 0x20),(double)in_RCX);
  *(int *)in_stack_00000028 = iVar3;
  iVar3 = vSolveUright(unaff_retaddr,unaff_RBX,vidx,in_XMM0_Qa,(int *)in_RSI,
                       (int)((ulong)in_RDX >> 0x20),(double)in_RCX);
  *(int *)x = iVar3;
  if (in_RDI[0x28] == 0) {
    iVar3 = vSolveUpdateRight(in_RSI,in_RDX,in_RCX,iVar4,(double)in_R9);
    *in_R9 = iVar3;
    iVar3 = vSolveUpdateRight(in_RSI,in_RDX,in_RCX,iVar4,(double)in_R9);
    *(int *)in_stack_00000028 = iVar3;
    iVar4 = vSolveUpdateRight(in_RSI,in_RDX,in_RCX,iVar4,(double)in_R9);
    *(int *)x = iVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}